

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int autoIncBegin(Parse *pParse,int iDb,Table *pTab)

{
  Table *pTVar1;
  int iVar2;
  bool bVar3;
  Parse *local_50;
  Table *pSeqTab;
  AutoincInfo *pInfo;
  Parse *pToplevel;
  int memId;
  Table *pTab_local;
  int iDb_local;
  Parse *pParse_local;
  
  pToplevel._4_4_ = 0;
  if (((pTab->tabFlags & 8) != 0) && ((pParse->db->mDbFlags & 4) == 0)) {
    local_50 = pParse;
    if (pParse->pToplevel != (Parse *)0x0) {
      local_50 = pParse->pToplevel;
    }
    pTVar1 = (pParse->db->aDb[iDb].pSchema)->pSeqTab;
    if ((((pTVar1 == (Table *)0x0) || ((pTVar1->tabFlags & 0x80) != 0)) ||
        (pTVar1->eTabType == '\x01')) || (pTVar1->nCol != 2)) {
      pParse->nErr = pParse->nErr + 1;
      pParse->rc = 0x20b;
      return 0;
    }
    pSeqTab = (Table *)local_50->pAinc;
    while( true ) {
      bVar3 = false;
      if (pSeqTab != (Table *)0x0) {
        bVar3 = (Table *)pSeqTab->aCol != pTab;
      }
      if (!bVar3) break;
      pSeqTab = (Table *)pSeqTab->zName;
    }
    if (pSeqTab == (Table *)0x0) {
      pSeqTab = (Table *)sqlite3DbMallocRawNN(pParse->db,0x18);
      sqlite3ParserAddCleanup(local_50,sqlite3DbFree,pSeqTab);
      if (pParse->db->mallocFailed != '\0') {
        return 0;
      }
      pSeqTab->zName = (char *)local_50->pAinc;
      local_50->pAinc = (AutoincInfo *)pSeqTab;
      pSeqTab->aCol = (Column *)pTab;
      *(int *)&pSeqTab->pIndex = iDb;
      local_50->nMem = local_50->nMem + 1;
      iVar2 = local_50->nMem + 1;
      local_50->nMem = iVar2;
      *(int *)((long)&pSeqTab->pIndex + 4) = iVar2;
      local_50->nMem = local_50->nMem + 2;
    }
    pToplevel._4_4_ = *(int *)((long)&pSeqTab->pIndex + 4);
  }
  return pToplevel._4_4_;
}

Assistant:

static int autoIncBegin(
  Parse *pParse,      /* Parsing context */
  int iDb,            /* Index of the database holding pTab */
  Table *pTab         /* The table we are writing to */
){
  int memId = 0;      /* Register holding maximum rowid */
  assert( pParse->db->aDb[iDb].pSchema!=0 );
  if( (pTab->tabFlags & TF_Autoincrement)!=0
   && (pParse->db->mDbFlags & DBFLAG_Vacuum)==0
  ){
    Parse *pToplevel = sqlite3ParseToplevel(pParse);
    AutoincInfo *pInfo;
    Table *pSeqTab = pParse->db->aDb[iDb].pSchema->pSeqTab;

    /* Verify that the sqlite_sequence table exists and is an ordinary
    ** rowid table with exactly two columns.
    ** Ticket d8dc2b3a58cd5dc2918a1d4acb 2018-05-23 */
    if( pSeqTab==0
     || !HasRowid(pSeqTab)
     || NEVER(IsVirtual(pSeqTab))
     || pSeqTab->nCol!=2
    ){
      pParse->nErr++;
      pParse->rc = SQLITE_CORRUPT_SEQUENCE;
      return 0;
    }

    pInfo = pToplevel->pAinc;
    while( pInfo && pInfo->pTab!=pTab ){ pInfo = pInfo->pNext; }
    if( pInfo==0 ){
      pInfo = sqlite3DbMallocRawNN(pParse->db, sizeof(*pInfo));
      sqlite3ParserAddCleanup(pToplevel, sqlite3DbFree, pInfo);
      testcase( pParse->earlyCleanup );
      if( pParse->db->mallocFailed ) return 0;
      pInfo->pNext = pToplevel->pAinc;
      pToplevel->pAinc = pInfo;
      pInfo->pTab = pTab;
      pInfo->iDb = iDb;
      pToplevel->nMem++;                  /* Register to hold name of table */
      pInfo->regCtr = ++pToplevel->nMem;  /* Max rowid register */
      pToplevel->nMem +=2;       /* Rowid in sqlite_sequence + orig max val */
    }
    memId = pInfo->regCtr;
  }
  return memId;
}